

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

void __thiscall
icu_63::UnicodeString::UnicodeString
          (UnicodeString *this,char *src,int32_t length,EInvariant param_3)

{
  ushort uVar1;
  UBool UVar2;
  size_t sVar3;
  char16_t *us;
  
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_003c0258
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 2;
  if (src != (char *)0x0) {
    if (length < 0) {
      sVar3 = strlen(src);
      length = (int32_t)sVar3;
    }
    UVar2 = cloneArrayIfNeeded(this,length,length,'\0',(int32_t **)0x0,'\0');
    if (UVar2 == '\0') {
      setToBogus(this);
    }
    else {
      if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
        us = (this->fUnion).fFields.fArray;
      }
      else {
        us = (this->fUnion).fStackFields.fBuffer;
      }
      u_charsToUChars_63(src,us,length);
      uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (length < 0x400) {
        (this->fUnion).fStackFields.fLengthAndFlags = (ushort)(length << 5) | uVar1 & 0x1f;
      }
      else {
        (this->fUnion).fStackFields.fLengthAndFlags = uVar1 | 0xffe0;
        (this->fUnion).fFields.fLength = length;
      }
    }
  }
  return;
}

Assistant:

UnicodeString::UnicodeString(const char *src, int32_t length, EInvariant) {
  fUnion.fFields.fLengthAndFlags = kShortString;
  if(src==NULL) {
    // treat as an empty string
  } else {
    if(length<0) {
      length=(int32_t)uprv_strlen(src);
    }
    if(cloneArrayIfNeeded(length, length, FALSE)) {
      u_charsToUChars(src, getArrayStart(), length);
      setLength(length);
    } else {
      setToBogus();
    }
  }
}